

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

boolean canletgo(obj *obj,char *word)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *word_local;
  obj *obj_local;
  
  if ((obj->owornmask & 0xf007fU) == 0) {
    if ((obj->otyp == 0x210) && ((*(uint *)&obj->field_0x4a & 1) != 0)) {
      if (*word != '\0') {
        iVar1 = strcmp(word,"throw");
        if ((iVar1 == 0) && (1 < obj->quan)) {
          obj->corpsenm = 1;
        }
        pcVar3 = "";
        if (obj->corpsenm != 0) {
          pcVar3 = " any of";
        }
        pcVar2 = "s";
        if (obj->quan == 1) {
          pcVar2 = "";
        }
        pline("For some reason, you cannot %s%s the stone%s!",word,pcVar3,pcVar2);
      }
      obj->corpsenm = 0;
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffffbf | 0x40;
      obj_local._7_1_ = '\0';
    }
    else if ((obj->otyp == 0xf1) && (obj->corpsenm != 0)) {
      if (*word != '\0') {
        pcVar3 = body_part(6);
        pline("The leash is tied around your %s.",pcVar3);
      }
      obj_local._7_1_ = '\0';
    }
    else if ((obj->owornmask & 0x100000U) == 0) {
      obj_local._7_1_ = '\x01';
    }
    else {
      if (*word != '\0') {
        pline("You cannot %s something you are sitting on.",word);
      }
      obj_local._7_1_ = '\0';
    }
  }
  else {
    if (*word != '\0') {
      Norep("You cannot %s something you are wearing.",word);
    }
    obj_local._7_1_ = '\0';
  }
  return obj_local._7_1_;
}

Assistant:

boolean canletgo(struct obj *obj, const char *word)
{
	if (obj->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL)){
		if (*word)
			Norep("You cannot %s something you are wearing.", word);
		return FALSE;
	}
	if (obj->otyp == LOADSTONE && obj->cursed) {
		/* getobj() kludge sets corpsenm to user's specified count
		   when refusing to split a stack of cursed loadstones */
		if (*word) {
			/* getobj() ignores a count for throwing since that is
			   implicitly forced to be 1; replicate its kludge... */
			if (!strcmp(word, "throw") && obj->quan > 1L)
			    obj->corpsenm = 1;
			pline("For some reason, you cannot %s%s the stone%s!",
			      word, obj->corpsenm ? " any of" : "",
			      plur(obj->quan));
		}
		obj->corpsenm = 0;		/* reset */
		obj->bknown = 1;
		return FALSE;
	}
	if (obj->otyp == LEASH && obj->leashmon != 0) {
		if (*word)
			pline("The leash is tied around your %s.",
					body_part(HAND));
		return FALSE;
	}
	if (obj->owornmask & W_SADDLE) {
		if (*word)
			pline("You cannot %s something you are sitting on.", word);
		return FALSE;
	}
	return TRUE;
}